

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Corrade::Containers::
  arrayAppend<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string,std::__cxx11::string>
            (Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
             *array,type *param_2,type *param_3)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
  *array_local;
  
  value = Implementation::
          arrayGrowBy<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    (array,1);
  first = Utility::forward<std::__cxx11::string>(param_2);
  next = Utility::forward<std::__cxx11::string>(param_3);
  Implementation::
  construct<std::pair<std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string,std::__cxx11::string>
            (value,first,next);
  return value;
}

Assistant:

T& arrayAppend(Array<T>& array, Corrade::InPlaceInitT, Args&&... args) {
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* No helper function as there's no way we could memcpy such a thing. */
    /* On GCC 4.8 this includes another workaround, see the 4.8-specific
       overload docs for details */
    Implementation::construct(*it, Utility::forward<Args>(args)...);
    return *it;
}